

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O1

void C_SetCVarsToDefaults(void)

{
  undefined8 in_RAX;
  UCVarValue value;
  FBaseCVar *this;
  ECVarType type;
  undefined8 uStack_18;
  undefined4 extraout_var;
  
  if (CVars != (FBaseCVar *)0x0) {
    this = CVars;
    uStack_18 = in_RAX;
    do {
      if ((this->Flags & 1) != 0) {
        value._0_4_ = (*this->_vptr_FBaseCVar[7])(this,(long)&uStack_18 + 4);
        value._4_4_ = extraout_var;
        FBaseCVar::SetGenericRep(this,value,uStack_18._4_4_);
      }
      this = this->m_Next;
    } while (this != (FBaseCVar *)0x0);
  }
  return;
}

Assistant:

void C_SetCVarsToDefaults (void)
{
	FBaseCVar *cvar = CVars;

	while (cvar)
	{
		// Only default save-able cvars
		if (cvar->Flags & CVAR_ARCHIVE)
		{
			UCVarValue val;
			ECVarType type;
			val = cvar->GetFavoriteRepDefault (&type);
			cvar->SetGenericRep (val, type);
		}
		cvar = cvar->m_Next;
	}
}